

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O0

void __thiscall DBOPL::Operator::WriteE0(Operator *this,Chip *chip,Bit8u val)

{
  byte bVar1;
  Bit8u waveForm;
  Bit8u val_local;
  Chip *chip_local;
  Operator *this_local;
  
  if (this->regE0 != val) {
    bVar1 = val & (chip->waveFormMask & 3 | chip->opl3Active & 7U);
    this->regE0 = val;
    this->waveBase = &WaveTable + (int)(uint)*(ushort *)(WaveBaseTable + (ulong)bVar1 * 2);
    this->waveStart = (uint)*(ushort *)(WaveStartTable + (ulong)bVar1 * 2) << 0x16;
    this->waveMask = (uint)*(ushort *)(WaveMaskTable + (ulong)bVar1 * 2);
  }
  return;
}

Assistant:

void Operator::WriteE0( const Chip* chip, Bit8u val ) {
	if ( !(regE0 ^ val) )
		return;
	//in opl3 mode you can always selet 7 waveforms regardless of waveformselect
	Bit8u waveForm = val & ( ( 0x3 & chip->waveFormMask ) | (0x7 & chip->opl3Active ) );
	regE0 = val;
#if ( DBOPL_WAVE == WAVE_HANDLER )
	waveHandler = WaveHandlerTable[ waveForm ];
#else
	waveBase = WaveTable + WaveBaseTable[ waveForm ];
	waveStart = WaveStartTable[ waveForm ] << WAVE_SH;
	waveMask = WaveMaskTable[ waveForm ];
#endif
}